

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequentialPropsCmd.cpp
# Opt level: O2

int check_possible_values(char *val,char **values)

{
  char *__s2;
  int iVar1;
  size_t __n;
  size_t sVar2;
  long lVar3;
  int iVar4;
  undefined8 uStack_38;
  
  if (val == (char *)0x0) {
    return -1;
  }
  __n = strlen(val);
  lVar3 = 0;
  iVar4 = 0;
  uStack_38 = 0;
  do {
    __s2 = values[lVar3];
    if (__s2 == (char *)0x0) {
      if (iVar4 != 1) {
        uStack_38._4_4_ = iVar4 == 0 | 0xfffffffe;
      }
      return uStack_38._4_4_;
    }
    iVar1 = strncmp(val,__s2,__n);
    if (iVar1 == 0) {
      sVar2 = strlen(__s2);
      if (sVar2 == __n) {
        return (int)lVar3;
      }
      iVar4 = iVar4 + 1;
      uStack_38 = lVar3 << 0x20;
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

static int
check_possible_values(const char *val, const char *values[])
{
  int i, found, last;
  size_t len;

  if (!val)   /* otherwise strlen() crashes below */
    return -1; /* -1 means no argument for the option */

  found = last = 0;

  for (i = 0, len = strlen(val); values[i]; ++i)
    {
      if (strncmp(val, values[i], len) == 0)
        {
          ++found;
          last = i;
          if (strlen(values[i]) == len)
            return i; /* exact macth no need to check more */
        }
    }

  if (found == 1) /* one match: OK */
    return last;

  return (found ? -2 : -1); /* return many values or none matched */
}